

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LameWrapper.cpp
# Opt level: O0

bool __thiscall
cinemo::LameWrapper::encodeStereo_4_16(LameWrapper *this,string *in,string *out,lame_t *lame)

{
  byte bVar1;
  _Ios_Openmode _Var2;
  long lVar3;
  undefined1 local_7c58 [8];
  uchar mp3_buff [10240];
  short wav_buff_r [5120];
  short wav_buff_l [5120];
  streamsize write;
  streamsize read;
  char local_438 [8];
  ofstream mp3;
  char local_238 [8];
  ifstream wav;
  lame_t *lame_local;
  string *out_local;
  string *in_local;
  LameWrapper *this_local;
  
  _Var2 = std::operator|(_S_in,_S_bin);
  std::ifstream::ifstream(local_238,(string *)in,_Var2);
  _Var2 = std::operator|(_S_out,_S_trunc);
  _Var2 = std::operator|(_Var2,_S_bin);
  std::ofstream::ofstream(local_438,(string *)out,_Var2);
  bVar1 = std::ifstream::is_open();
  if (((bVar1 & 1) == 0) || (bVar1 = std::ofstream::is_open(), (bVar1 & 1) == 0)) {
    std::__cxx11::string::append((char *)&this->message_buffer);
    this_local._7_1_ = false;
  }
  else {
    std::unique_ptr<cinemo::wh::WaveHeader,_std::default_delete<cinemo::wh::WaveHeader>_>::
    operator->(&this->wh);
    std::istream::ignore((long)local_238);
    do {
      std::istream::read(local_238,(long)(wav_buff_r + 0x13fc));
      std::istream::read(local_238,(long)(mp3_buff + 0x27f8));
      lVar3 = std::istream::gcount();
      if (lVar3 == 0) {
        lame_encode_flush(*lame,local_7c58,0x2800);
      }
      else {
        lame_encode_buffer(*lame,wav_buff_r + 0x13fc,mp3_buff + 0x27f8,1,local_7c58,0x2800);
      }
      std::ostream::write(local_438,(long)local_7c58);
    } while (lVar3 != 0);
    std::ifstream::close();
    std::ofstream::close();
    this_local._7_1_ = true;
  }
  std::ofstream::~ofstream(local_438);
  std::ifstream::~ifstream(local_238);
  return this_local._7_1_;
}

Assistant:

bool LameWrapper::encodeStereo_4_16(const string& in, const string& out,
                                        const lame_t& lame) {

        std::ifstream wav(in, std::ios_base::in | std::ios_base::binary);
        std::ofstream mp3(out, std::ios_base::out | std::ios_base::trunc |
                               std::ios_base::binary);

        //just to make sure...
        if (!wav.is_open() || !mp3.is_open()) {
			message_buffer.append("Error in reading / writing source and destination files.");
            return false;
        }

        std::streamsize read, write;

        //short int wav_buff[WAV_BUFF_SIZE]; //all channels
        short int wav_buff_l[WAV_BUFF_SIZE / 2]; //left channel
        short int wav_buff_r[WAV_BUFF_SIZE / 2]; //right channel
        unsigned char mp3_buff[MP3_BUFF_SIZE];

        wav.ignore(wh->DataBegin); //skip to data

        do {
            wav.read(reinterpret_cast<char*>(&wav_buff_l), sizeof(short int));
            wav.read(reinterpret_cast<char*>(&wav_buff_r), sizeof(short int));
            read = wav.gcount();

            if (read == 0) { //reading from wav file has ended!
				write = lame_encode_flush(lame,
							reinterpret_cast<unsigned char*>(&mp3_buff),
							MP3_BUFF_SIZE);
            } else { //encoding
                write = lame_encode_buffer(lame,
                            &wav_buff_l[0],
                            &wav_buff_r[0],
                            1,
                            mp3_buff,
                            MP3_BUFF_SIZE);

            }
            mp3.write(reinterpret_cast<char*>(&mp3_buff), write);
        } while (read != 0);

        wav.close();
        mp3.close();

        return true;
    }